

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::InputDeclaration::InputDeclaration(InputDeclaration *this,CodeLocation *l)

{
  CodeLocation local_28;
  CodeLocation *local_18;
  CodeLocation *l_local;
  InputDeclaration *this_local;
  
  local_18 = l;
  l_local = (CodeLocation *)this;
  CodeLocation::CodeLocation(&local_28,l);
  IODeclaration::IODeclaration(&this->super_IODeclaration,&local_28);
  CodeLocation::~CodeLocation(&local_28);
  (this->super_IODeclaration).super_Object._vptr_Object =
       (_func_int **)&PTR__InputDeclaration_00641378;
  return;
}

Assistant:

InputDeclaration (CodeLocation l) : IODeclaration (std::move (l)) {}